

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O1

ChFrameMoving<double> * __thiscall
chrono::ChFrameMoving<double>::operator=(ChFrameMoving<double> *this,ChFrameMoving<double> *other)

{
  if (other != this) {
    ChFrame<double>::operator=(&this->super_ChFrame<double>,&other->super_ChFrame<double>);
    (this->coord_dt).pos.m_data[0] = (other->coord_dt).pos.m_data[0];
    (this->coord_dt).pos.m_data[1] = (other->coord_dt).pos.m_data[1];
    (this->coord_dt).pos.m_data[2] = (other->coord_dt).pos.m_data[2];
    (this->coord_dt).rot.m_data[0] = (other->coord_dt).rot.m_data[0];
    (this->coord_dt).rot.m_data[1] = (other->coord_dt).rot.m_data[1];
    (this->coord_dt).rot.m_data[2] = (other->coord_dt).rot.m_data[2];
    (this->coord_dt).rot.m_data[3] = (other->coord_dt).rot.m_data[3];
    (this->coord_dtdt).pos.m_data[0] = (other->coord_dtdt).pos.m_data[0];
    (this->coord_dtdt).pos.m_data[1] = (other->coord_dtdt).pos.m_data[1];
    (this->coord_dtdt).pos.m_data[2] = (other->coord_dtdt).pos.m_data[2];
    (this->coord_dtdt).rot.m_data[0] = (other->coord_dtdt).rot.m_data[0];
    (this->coord_dtdt).rot.m_data[1] = (other->coord_dtdt).rot.m_data[1];
    (this->coord_dtdt).rot.m_data[2] = (other->coord_dtdt).rot.m_data[2];
    (this->coord_dtdt).rot.m_data[3] = (other->coord_dtdt).rot.m_data[3];
  }
  return this;
}

Assistant:

ChFrameMoving<Real>& operator=(const ChFrameMoving<Real>& other) {
        if (&other == this)
            return *this;
        ChFrame<Real>::operator=(other);
        coord_dt = other.coord_dt;
        coord_dtdt = other.coord_dtdt;
        return *this;
    }